

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uconv.h
# Opt level: O3

string_type * __thiscall
booster::locale::impl_icu::icu_std_converter<wchar_t,4>::std_abi_cxx11_
          (string_type *__return_storage_ptr__,void *this,UnicodeString *str)

{
  ushort uVar1;
  wchar_t wVar2;
  runtime_error *this_00;
  char *pcVar3;
  int iVar4;
  UnicodeString *pUVar5;
  UErrorCode code;
  int32_t len;
  allocator local_51;
  int local_50;
  wchar_t local_4c;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  if (*(short *)(str + 8) < 0) {
    wVar2 = *(wchar_t *)(str + 0xc);
  }
  else {
    wVar2 = (int)*(short *)(str + 8) >> 5;
  }
  pUVar5 = (UnicodeString *)0x0;
  std::__cxx11::wstring::resize((ulong)__return_storage_ptr__,wVar2);
  local_4c = L'\0';
  local_50 = 0;
  uVar1 = *(ushort *)(str + 8);
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      pUVar5 = *(UnicodeString **)(str + 0x18);
    }
    else {
      pUVar5 = str + 10;
    }
  }
  if ((short)uVar1 < 0) {
    iVar4 = *(int *)(str + 0xc);
  }
  else {
    iVar4 = (int)(short)uVar1 >> 5;
  }
  u_strToUTF32_70((__return_storage_ptr__->_M_dataplus)._M_p,
                  __return_storage_ptr__->_M_string_length,&local_4c,pUVar5,iVar4,&local_50);
  iVar4 = local_50;
  if (local_50 < 1) {
    std::__cxx11::wstring::resize((ulong)__return_storage_ptr__,local_4c);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  pcVar3 = (char *)u_errorName_70(iVar4);
  std::__cxx11::string::string((string *)&local_48,pcVar3,&local_51);
  runtime_error::runtime_error(this_00,&local_48);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

string_type std(icu::UnicodeString const &str) const
        {
            string_type tmp;
            tmp.resize(str.length());
            UChar32 *ptr=reinterpret_cast<UChar32 *>(&tmp[0]);

            #ifdef __SUNPRO_CC
            int len=0;
            #else
            ::int32_t len=0;
            #endif

            UErrorCode code=U_ZERO_ERROR;
            u_strToUTF32(ptr,tmp.size(),&len,str.getBuffer(),str.length(),&code);

            check_and_throw_icu_error(code);

            tmp.resize(len);

            return tmp;
        }